

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeWindow.cpp
# Opt level: O0

IVec2 __thiscall eglu::NativeWindow::getScreenSize(NativeWindow *this)

{
  deBool dVar1;
  InternalError *this_00;
  NotSupportedError *this_01;
  long in_RSI;
  NativeWindow *this_local;
  
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || ((*(uint *)(in_RSI + 8) & 0x10) != 0)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,
                 "eglu::NativeWindow doesn\'t support querying the size of the window on the screen"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
                 ,0x42);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,"(m_capabilities & CAPABILITY_GET_SCREEN_SIZE) == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
             ,0x41);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

tcu::IVec2 NativeWindow::getScreenSize (void) const
{
	TCU_CHECK_INTERNAL((m_capabilities & CAPABILITY_GET_SCREEN_SIZE) == 0);
	throw tcu::NotSupportedError("eglu::NativeWindow doesn't support querying the size of the window on the screen", DE_NULL, __FILE__, __LINE__);
}